

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

QByteArray * QString::toLatin1_helper_inplace(QByteArray *__return_storage_ptr__,QString *s)

{
  qsizetype *pqVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  QTypedArrayData<char16_t> *__old_val;
  QStringView string;
  
  pDVar2 = (s->d).d;
  if ((pDVar2 == (Data *)0x0) ||
     ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 1)) {
    string.m_data = (s->d).ptr;
    string.m_size = (s->d).size;
    qt_convert_to_latin1(__return_storage_ptr__,string);
  }
  else {
    pcVar3 = (s->d).ptr;
    qt_to_latin1((uchar *)pcVar3,pcVar3,(s->d).size + 1);
    pDVar2 = (s->d).d;
    pqVar1 = &(pDVar2->super_QArrayData).alloc;
    *pqVar1 = *pqVar1 << 1;
    pcVar3 = (s->d).ptr;
    qVar4 = (s->d).size;
    (s->d).d = (Data *)0x0;
    (s->d).ptr = (char16_t *)0x0;
    (s->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)pDVar2;
    (__return_storage_ptr__->d).ptr = (char *)pcVar3;
    (__return_storage_ptr__->d).size = qVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QString::toLatin1_helper_inplace(QString &s)
{
    if (!s.isDetached())
        return qt_convert_to_latin1(s);

    // We can return our own buffer to the caller.
    // Conversion to Latin-1 always shrinks the buffer by half.
    // This relies on the fact that we use QArrayData for everything behind the scenes

    // First, do the in-place conversion. Since isDetached() == true, the data
    // was allocated by QArrayData, so the null terminator must be there.
    qsizetype length = s.size();
    char16_t *sdata = s.d->data();
    Q_ASSERT(sdata[length] == u'\0');
    qt_to_latin1(reinterpret_cast<uchar *>(sdata), sdata, length + 1);

    // Move the internals over to the byte array.
    // Kids, avert your eyes. Don't try this at home.
    auto ba_d = std::move(s.d).reinterpreted<char>();

    // Some sanity checks
    Q_ASSERT(ba_d.d->allocatedCapacity() >= ba_d.size);
    Q_ASSERT(s.isNull());
    Q_ASSERT(s.isEmpty());
    Q_ASSERT(s.constData() == QString().constData());

    return QByteArray(std::move(ba_d));
}